

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O2

PropertyRecord * Js::InternalPropertyRecords::GetInternalPropertyName(PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xf < (uint)propertyId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x6d,"(IsInternalPropertyId(propertyId))",
                                "IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((uint)propertyId < 0x10) {
    return (PropertyRecord *)(&PTR_TypeOfPrototypeObjectInlined_013780e8)[(uint)propertyId];
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

const PropertyRecord* InternalPropertyRecords::GetInternalPropertyName(PropertyId propertyId)
    {
        Assert(IsInternalPropertyId(propertyId));

        switch (propertyId)
        {
#define INTERNALPROPERTY(name) \
            case InternalPropertyIds::name: \
                return InternalPropertyRecords::name;
#include "InternalPropertyList.h"
        }

        Throw::FatalInternalError();
    }